

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastInt32ToBufferLeft(int32 i,char *buffer)

{
  char *pcVar1;
  ulong uVar2;
  
  if (i < 0) {
    *buffer = '-';
    pcVar1 = FastUInt32ToBufferLeft(-i,buffer + 1);
    return pcVar1;
  }
  if ((uint)i < 1000000000) {
    if (99 < (uint)i) {
      if (9999 < (uint)i) {
        if (999999 < (uint)i) {
          if (99999999 < (uint)i) {
            uVar2 = (ulong)(uint)i / 100000000;
            *buffer = (byte)((uint)i / 100000000) | 0x30;
            buffer = buffer + 1;
            goto LAB_0039c0c9;
          }
          if (9999999 < (uint)i) goto LAB_0039c0d1;
          uVar2 = (ulong)(uint)i / 1000000;
          *buffer = (char)((uint)i / 1000000) + '0';
          buffer = buffer + 1;
          goto LAB_0039c0f0;
        }
        if (99999 < (uint)i) goto LAB_0039c0f8;
        uVar2 = (ulong)(uint)i / 10000;
        *buffer = (byte)((uint)i / 10000) | 0x30;
        buffer = buffer + 1;
        goto LAB_0039c119;
      }
      if (999 < (uint)i) goto LAB_0039c121;
      uVar2 = (ulong)(uint)i / 100;
      *buffer = (byte)((uint)i / 100) | 0x30;
      buffer = buffer + 1;
      goto LAB_0039c140;
    }
    if ((uint)i < 10) {
      *buffer = (byte)i | 0x30;
      pcVar1 = buffer + 1;
      goto LAB_0039c159;
    }
  }
  else {
    uVar2 = (ulong)(uint)i / 100000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_0039c0c9:
    i = i + (int)uVar2 * -100000000;
LAB_0039c0d1:
    uVar2 = (ulong)(uint)i / 1000000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_0039c0f0:
    i = i + (int)uVar2 * -1000000;
LAB_0039c0f8:
    uVar2 = (ulong)(uint)i / 10000;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_0039c119:
    i = i + (int)uVar2 * -10000;
LAB_0039c121:
    uVar2 = (ulong)(uint)i / 100;
    *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + uVar2 * 2);
    buffer = buffer + 2;
LAB_0039c140:
    i = i + (int)uVar2 * -100;
  }
  *(undefined2 *)buffer = *(undefined2 *)(two_ASCII_digits + (ulong)(uint)i * 2);
  pcVar1 = buffer + 2;
LAB_0039c159:
  *pcVar1 = '\0';
  return pcVar1;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}